

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O1

void __thiscall
UnifiedRegex::
SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
::SyncToLiteralAndContinueInstT
          (SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
           *this,InstTag tag,CharCount offset,CharCount length)

{
  ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_> *pSVar1;
  
  (this->super_Inst).tag = tag;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).
  super_LiteralMixin.offset = offset;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).
  super_LiteralMixin.length = length;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).scanner.
  lastOccurrence.defv = -1;
  pSVar1 = &this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>;
  (pSVar1->scanner).lastOccurrence.map[0] = 0;
  (pSVar1->scanner).lastOccurrence.map[1] = 0;
  (pSVar1->scanner).lastOccurrence.map[2] = 0;
  (pSVar1->scanner).lastOccurrence.map[3] = 0;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).scanner.
  lastOccurrence.lastOcc[0] = -1;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).scanner.
  lastOccurrence.lastOcc[1] = -1;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).scanner.
  lastOccurrence.lastOcc[2] = -1;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).scanner.
  lastOccurrence.lastOcc[3] = -1;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).scanner.
  goodSuffix = (int32 *)0x0;
  return;
}

Assistant:

SyncToLiteralAndContinueInstT(InstTag tag, CharCount offset, CharCount length) : Inst(tag), ScannerT(offset, length) {}